

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
dynet::DotProduct::dim_forward
          (Dim *__return_storage_ptr__,DotProduct *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  ulong uVar4;
  long lVar5;
  
  pDVar1 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 == 0x48) {
    if (1 < (ulong)pDVar1->nd) {
      uVar4 = 1;
      do {
        if (pDVar1->d[uVar4] != 1) goto LAB_00399414;
        uVar4 = uVar4 + 1;
      } while (pDVar1->nd != uVar4);
    }
    if (1 < (ulong)pDVar1[1].nd) {
      lVar5 = 0;
      do {
        if (pDVar1[1].d[lVar5 + 1] != 1) goto LAB_00399414;
        lVar5 = lVar5 + 1;
      } while ((ulong)pDVar1[1].nd - 1 != lVar5);
    }
    if (pDVar1->d[0] == pDVar1[1].d[0]) {
      uVar2 = pDVar1[1].bd;
      if (pDVar1[1].bd < pDVar1->bd) {
        uVar2 = pDVar1->bd;
      }
      __return_storage_ptr__->bd = uVar2;
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->d[0] = 1;
      return __return_storage_ptr__;
    }
  }
LAB_00399414:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments to DotProduct: ",0x1d);
  poVar3 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Bad arguments to DotProduct");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim DotProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      !LooksLikeVector(xs[0]) ||
      !LooksLikeVector(xs[1]) ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad arguments to DotProduct: " << xs << endl;
    throw std::invalid_argument("Bad arguments to DotProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}